

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTupleMake(TranslateToFuzzReader *this,Type type)

{
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar1;
  char cVar2;
  uintptr_t *puVar3;
  TupleMake *pTVar4;
  Type *pTVar5;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar6;
  Type local_70;
  Type type_local;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> elements;
  Iterator __begin1;
  
  local_70.id = type.id;
  if (((byte)this->wasm[0x109] & 2) == 0) {
    __assert_fail("wasm.features.hasMultivalue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x611,"Expression *wasm::TranslateToFuzzReader::makeTupleMake(Type)");
  }
  cVar2 = wasm::Type::isTuple();
  if (cVar2 == '\0') {
    __assert_fail("type.isTuple()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x612,"Expression *wasm::TranslateToFuzzReader::makeTupleMake(Type)");
  }
  auStack_58 = (undefined1  [8])0x0;
  elements.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  elements.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  elements.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_70;
  PVar6 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::end(&local_70);
  pTVar5 = &local_70;
  for (; PVar1.index = (size_t)__begin1.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent, PVar1.parent = pTVar5, PVar6 != PVar1;
      __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1)) {
    puVar3 = (uintptr_t *)
             wasm::Type::Iterator::operator*
                       ((Iterator *)
                        &elements.
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    type_local.id = (uintptr_t)make(this,*puVar3);
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_58,
               (Expression **)&type_local);
    pTVar5 = (Type *)elements.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  pTVar4 = Builder::makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                     (&this->builder,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_58)
  ;
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_58);
  return (Expression *)pTVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeTupleMake(Type type) {
  assert(wasm.features.hasMultivalue());
  assert(type.isTuple());
  std::vector<Expression*> elements;
  for (const auto& t : type) {
    elements.push_back(make(t));
  }
  return builder.makeTupleMake(std::move(elements));
}